

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Integrator.cpp
# Opt level: O0

void __thiscall
OpenMD::Integrator::setFluctuatingChargePropagator
          (Integrator *this,FluctuatingChargePropagator *prop)

{
  long in_RSI;
  long in_RDI;
  
  if (((in_RSI != *(long *)(in_RDI + 0x90)) && (*(long *)(in_RDI + 0x90) != 0)) &&
     (*(long **)(in_RDI + 0x90) != (long *)0x0)) {
    (**(code **)(**(long **)(in_RDI + 0x90) + 8))();
  }
  *(long *)(in_RDI + 0x90) = in_RSI;
  if (*(long *)(in_RDI + 0x80) != 0) {
    (**(code **)(**(long **)(in_RDI + 0x90) + 0x48))
              (*(long **)(in_RDI + 0x90),*(undefined8 *)(in_RDI + 0x80));
  }
  return;
}

Assistant:

void Integrator::setFluctuatingChargePropagator(
      FluctuatingChargePropagator* prop) {
    if (prop != flucQ_ && flucQ_ != NULL) { delete flucQ_; }
    flucQ_ = prop;
    if (forceMan_ != NULL) { flucQ_->setForceManager(forceMan_); }
  }